

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgVariableManager.cpp
# Opt level: O2

Variable * __thiscall
rsg::VariableScope::allocate(VariableScope *this,VariableType *type,Storage storage,char *name)

{
  Variable *this_00;
  Variable *variable;
  Variable *local_30;
  
  this_00 = (Variable *)operator_new(0x80);
  rsg::Variable::Variable(this_00,type,storage,name);
  local_30 = this_00;
  std::vector<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>::push_back
            (&this->m_liveVariables,&local_30);
  return local_30;
}

Assistant:

Variable* VariableScope::allocate (const VariableType& type, Variable::Storage storage, const char* name)
{
	Variable* variable = new Variable(type, storage, name);
	try
	{
		m_liveVariables.push_back(variable);
		return variable;
	}
	catch (const std::exception&)
	{
		delete variable;
		throw;
	}
}